

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O0

int check_matrix(SUNMatrix A,SUNMatrix B,sunrealtype tol)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunindextype i;
  sunindextype Bldata;
  sunindextype Aldata;
  sunrealtype *Bdata;
  sunrealtype *Adata;
  int failure;
  long local_50;
  int local_24;
  int local_4;
  
  local_24 = 0;
  lVar2 = SUNDenseMatrix_Data(in_RDI);
  lVar3 = SUNDenseMatrix_Data(in_RSI);
  lVar4 = SUNDenseMatrix_LData(in_RDI);
  lVar5 = SUNDenseMatrix_LData(in_RSI);
  if (lVar4 == lVar5) {
    for (local_50 = 0; local_50 < lVar4; local_50 = local_50 + 1) {
      iVar1 = SUNRCompareTol(*(undefined8 *)(lVar2 + local_50 * 8),
                             *(undefined8 *)(lVar3 + local_50 * 8),in_XMM0_Qa);
      local_24 = iVar1 + local_24;
    }
    if ((double)local_24 <= 0.0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    printf(">>> ERROR: check_matrix: Different data array lengths \n");
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int check_matrix(SUNMatrix A, SUNMatrix B, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *Adata, *Bdata;
  sunindextype Aldata, Bldata;
  sunindextype i;

  /* get data pointers */
  Adata = SUNDenseMatrix_Data(A);
  Bdata = SUNDenseMatrix_Data(B);

  /* get and check data lengths */
  Aldata = SUNDenseMatrix_LData(A);
  Bldata = SUNDenseMatrix_LData(B);

  if (Aldata != Bldata)
  {
    printf(">>> ERROR: check_matrix: Different data array lengths \n");
    return (1);
  }

  /* compare data */
  for (i = 0; i < Aldata; i++)
  {
    failure += SUNRCompareTol(Adata[i], Bdata[i], tol);
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}